

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_tessellation.cpp
# Opt level: O3

bool dxil_spv::emit_store_patch_constant_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  bool bVar2;
  Id IVar3;
  uint uVar4;
  Id IVar5;
  Id IVar6;
  Builder *this;
  Operation *pOVar7;
  Value *pVVar8;
  Operation *pOVar9;
  Type *this_00;
  LoggingCallback p_Var10;
  void *pvVar11;
  mapped_type *pmVar12;
  Op OVar13;
  Id *pIVar14;
  BuiltIn builtin;
  uint32_t output_element_index;
  char buffer [4096];
  Id local_1058;
  BuiltIn local_1054;
  mapped_type *local_1050;
  Id local_1048;
  uint32_t local_1044;
  CallInst *local_1040;
  char local_1038 [4104];
  
  this = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand(&instruction->super_Instruction,1,&local_1044);
  if (bVar2) {
    local_1050 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->patch_elements_meta,&local_1044);
    pmVar12 = (mapped_type *)&(impl->execution_mode_meta).patch_lowering_array_var_id;
    if (local_1050->lowering == false) {
      pmVar12 = local_1050;
    }
    local_1058 = (pmVar12->super_ElementMeta).id;
    IVar3 = spv::Builder::getDerefTypeId(this,local_1058);
    OVar13 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[IVar3]->opCode & ~OpUndef;
    if (OVar13 == OpTypeArray) {
      IVar3 = spv::Builder::getContainedTypeId(this,IVar3);
      uVar4 = spv::Builder::getNumTypeConstituents(this,IVar3);
      bVar2 = 1 < uVar4;
LAB_00168347:
      pmVar12 = local_1050;
      bVar1 = local_1050->lowering;
      local_1048 = local_1058;
      local_1040 = instruction;
      IVar3 = spv::Builder::getScalarTypeId(this,IVar3);
      instruction = local_1040;
      IVar3 = spv::Builder::makePointer
                        (this,(uint)bVar1 + (uint)bVar1 * 2 + StorageClassOutput,IVar3);
      pOVar7 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
      local_1058 = pOVar7->id;
      Operation::add_id(pOVar7,local_1048);
      if (OVar13 == OpTypeArray) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
        IVar3 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
        if (pmVar12->lowering == true) {
          if (pmVar12->start_row != 0) {
            pIVar14 = &pmVar12->start_row;
LAB_00168416:
            IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
            pOVar9 = Converter::Impl::allocate(impl,OpIAdd,IVar5);
            Operation::add_id(pOVar9,IVar3);
            uVar4 = *pIVar14;
            IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
            IVar3 = spv::Builder::makeIntConstant(this,IVar3,uVar4,false);
            Operation::add_id(pOVar9,IVar3);
            Converter::Impl::add(impl,pOVar9,false);
            IVar3 = pOVar9->id;
            instruction = local_1040;
            pmVar12 = local_1050;
          }
        }
        else if ((pmVar12->super_ElementMeta).semantic_offset != 0) {
          pIVar14 = &(pmVar12->super_ElementMeta).semantic_offset;
          goto LAB_00168416;
        }
        Operation::add_id(pOVar7,IVar3);
      }
      if (bVar2) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
        IVar3 = Converter::Impl::get_id_for_value(impl,pVVar8,0x20);
        if ((pmVar12->lowering == true) && (pmVar12->start_col != 0)) {
          IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
          pOVar9 = Converter::Impl::allocate(impl,OpIAdd,IVar5);
          Operation::add_id(pOVar9,IVar3);
          uVar4 = pmVar12->start_col;
          IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
          IVar3 = spv::Builder::makeIntConstant(this,IVar3,uVar4,false);
          Operation::add_id(pOVar9,IVar3);
          Converter::Impl::add(impl,pOVar9,false);
          IVar3 = pOVar9->id;
        }
        Operation::add_id(pOVar7,IVar3);
      }
      Converter::Impl::add(impl,pOVar7,false);
    }
    else {
      uVar4 = spv::Builder::getNumTypeConstituents(this,IVar3);
      bVar2 = true;
      pmVar12 = local_1050;
      if (1 < uVar4) goto LAB_00168347;
    }
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    this_00 = LLVMBC::Value::getType(pVVar8);
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    IVar3 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    Converter::Impl::register_externally_visible_write(impl,pVVar8);
    local_1054 = BuiltInPosition;
    if (((((impl->options).max_tess_factor != 0) &&
         (bVar2 = SPIRVModule::query_builtin_shader_input
                            (impl->spirv_module,(pmVar12->super_ElementMeta).id,&local_1054), bVar2)
         ) && (local_1054 - BuiltInTessLevelOuter < 2)) &&
       ((bVar2 = LLVMBC::Type::isFloatingPointTy(this_00), bVar2 &&
        (bVar2 = type_is_64bit(this_00), !bVar2)))) {
      IVar5 = spv::Builder::makeFloatConstant(this,(float)(impl->options).max_tess_factor,false);
      bVar2 = type_is_16bit(this_00);
      if (bVar2) {
        IVar5 = Converter::Impl::build_value_cast(impl,IVar5,F32,F16,1);
      }
      if (impl->glsl_std450_ext == 0) {
        IVar6 = spv::Builder::import(this,"GLSL.std.450");
        impl->glsl_std450_ext = IVar6;
      }
      IVar6 = Converter::Impl::get_type_id(impl,this_00,0);
      pOVar7 = Converter::Impl::allocate(impl,OpExtInst,IVar6);
      Operation::add_id(pOVar7,impl->glsl_std450_ext);
      Operation::add_literal(pOVar7,0x4f);
      Operation::add_id(pOVar7,IVar3);
      Operation::add_id(pOVar7,IVar5);
      Converter::Impl::add(impl,pOVar7,false);
      IVar3 = pOVar7->id;
      pmVar12 = local_1050;
    }
    pOVar7 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar7,local_1058);
    if (pmVar12->lowering == true) {
      bVar2 = type_is_64bit(this_00);
      if (bVar2) {
        p_Var10 = get_thread_log_callback();
        if (p_Var10 == (LoggingCallback)0x0) {
          emit_store_patch_constant_instruction();
        }
        else {
          builtin_strncpy(local_1038,"Lowering for dxbc 64-bit patch output not supported.\n",0x36);
          pvVar11 = get_thread_log_callback_userdata();
          (*p_Var10)(pvVar11,Error,local_1038);
        }
        goto LAB_0016875a;
      }
      bVar2 = LLVMBC::Type::isIntegerTy(this_00);
      if (!bVar2) {
        IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
        pOVar9 = Converter::Impl::allocate(impl,OpBitcast,IVar5);
        Operation::add_id(pOVar9,IVar3);
        Converter::Impl::add(impl,pOVar9,false);
        IVar3 = pOVar9->id;
      }
    }
    else {
      IVar3 = Converter::Impl::fixup_store_type_io
                        (impl,(pmVar12->super_ElementMeta).component_type,1,IVar3);
    }
    Operation::add_id(pOVar7,IVar3);
    Converter::Impl::add(impl,pOVar7,false);
    bVar2 = true;
  }
  else {
LAB_0016875a:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool emit_store_patch_constant_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t output_element_index;
	if (!get_constant_operand(instruction, 1, &output_element_index))
		return false;

	const auto &meta = impl.patch_elements_meta[output_element_index];
	uint32_t var_id = meta.id;

	if (meta.lowering)
		var_id = impl.execution_mode_meta.patch_lowering_array_var_id;

	spv::Id ptr_id;

	spv::Id output_type_id = builder.getDerefTypeId(var_id);

	bool row_index = false;
	if (builder.isArrayType(output_type_id))
	{
		row_index = true;
		output_type_id = builder.getContainedTypeId(output_type_id);
	}
	uint32_t num_cols = builder.getNumTypeComponents(output_type_id);

	if (row_index || num_cols > 1)
	{
		Operation *op = impl.allocate(
			spv::OpAccessChain, builder.makePointer(
				meta.lowering ? spv::StorageClassPrivate : spv::StorageClassOutput,
				builder.getScalarTypeId(output_type_id)));

		ptr_id = op->id;
		op->add_id(var_id);

		if (row_index)
		{
			spv::Id row_id = impl.get_id_for_value(instruction->getOperand(2));
			if (meta.lowering && meta.start_row != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.start_row));
				impl.add(add_op);

				row_id = add_op->id;
			}
			else if (!meta.lowering && meta.semantic_offset)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.semantic_offset));
				impl.add(add_op);

				row_id = add_op->id;
			}

			op->add_id(row_id);
		}

		if (num_cols > 1)
		{
			spv::Id col_id = impl.get_id_for_value(instruction->getOperand(3), 32);
			if (meta.lowering && meta.start_col != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(col_id);
				add_op->add_id(builder.makeUintConstant(meta.start_col));
				impl.add(add_op);

				col_id = add_op->id;
			}
			op->add_id(col_id);
		}

		impl.add(op);
	}
	else
		ptr_id = var_id;

	auto *storage_type = instruction->getOperand(4)->getType();

	spv::Id store_value = impl.get_id_for_value(instruction->getOperand(4));
	impl.register_externally_visible_write(instruction->getOperand(4));

	// Tess factors are for some reason classified as inputs
	spv::BuiltIn builtin = { };

	if (impl.options.max_tess_factor &&
	    impl.spirv_module.query_builtin_shader_input(meta.id, &builtin) &&
	    (builtin == spv::BuiltInTessLevelInner || builtin == spv::BuiltInTessLevelOuter) &&
	    storage_type->isFloatingPointTy() && !type_is_64bit(storage_type))
	{
		spv::Id max_tess_factor_id = builder.makeFloatConstant(impl.options.max_tess_factor);

		// Don't bother bit-twiddling this into an fp16 constant manually
		if (type_is_16bit(storage_type))
		{
			max_tess_factor_id = impl.build_value_cast(max_tess_factor_id, DXIL::ComponentType::F32,
			                                           DXIL::ComponentType::F16, 1);
		}

		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		auto *min_op = impl.allocate(spv::OpExtInst, impl.get_type_id(storage_type));
		min_op->add_id(impl.glsl_std450_ext);
		min_op->add_literal(GLSLstd450::GLSLstd450NMin);
		min_op->add_id(store_value);
		min_op->add_id(max_tess_factor_id);
		impl.add(min_op);

		store_value = min_op->id;
	}

	Operation *op = impl.allocate(spv::OpStore);
	op->add_id(ptr_id);

	if (meta.lowering)
	{
		if (type_is_64bit(storage_type))
		{
			LOGE("Lowering for dxbc 64-bit patch output not supported.\n");
			return false;
		}

		if (!storage_type->isIntegerTy())
		{
			auto *cast_op = impl.allocate(spv::OpBitcast, builder.makeUintType(32));
			cast_op->add_id(store_value);
			impl.add(cast_op);
			store_value = cast_op->id;
		}
	}
	else
	{
		store_value = impl.fixup_store_type_io(meta.component_type, 1, store_value);
	}

	op->add_id(store_value);
	impl.add(op);
	return true;
}